

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int zbuild_huffman(zhuffman *z,uint8 *sizelist,int num)

{
  byte bVar1;
  int iVar2;
  uint bits;
  int local_d4;
  int k_1;
  int c;
  int s;
  int sizes [17];
  int aiStack_78 [2];
  int next_code [16];
  int local_30;
  int local_2c;
  int code;
  int k;
  int i;
  int num_local;
  uint8 *sizelist_local;
  zhuffman *z_local;
  
  local_2c = 0;
  memset(&c,0,0x44);
  memset(z,0xff,0x400);
  for (code = 0; code < num; code = code + 1) {
    (&c)[sizelist[code]] = (&c)[sizelist[code]] + 1;
  }
  c = 0;
  for (code = 1; code < 0x10; code = code + 1) {
    if (1 << ((byte)code & 0x1f) < (&c)[code]) {
      __assert_fail("sizes[i] <= (1 << i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                    ,0x673,"int zbuild_huffman(zhuffman *, uint8 *, int)");
    }
  }
  local_30 = 0;
  code = 1;
  while( true ) {
    if (0xf < code) {
      z->maxcode[0x10] = 0x10000;
      for (code = 0; code < num; code = code + 1) {
        bVar1 = sizelist[code];
        bits = (uint)bVar1;
        if (bits != 0) {
          iVar2 = (aiStack_78[(int)bits] - (uint)z->firstcode[(int)bits]) +
                  (uint)z->firstsymbol[(int)bits];
          z->size[iVar2] = bVar1;
          z->value[iVar2] = (uint16)code;
          if (bits < 10) {
            for (local_d4 = bit_reverse(aiStack_78[(int)bits],bits); local_d4 < 0x200;
                local_d4 = (1 << (bVar1 & 0x1f)) + local_d4) {
              z->fast[local_d4] = (uint16)iVar2;
            }
          }
          aiStack_78[(int)bits] = aiStack_78[(int)bits] + 1;
        }
      }
      return 1;
    }
    aiStack_78[code] = local_30;
    z->firstcode[code] = (uint16)local_30;
    z->firstsymbol[code] = (uint16)local_2c;
    local_30 = local_30 + (&c)[code];
    if (((&c)[code] != 0) && (1 << ((byte)code & 0x1f) <= local_30 + -1)) break;
    z->maxcode[code] = local_30 << (0x10 - (byte)code & 0x1f);
    local_30 = local_30 * 2;
    local_2c = (&c)[code] + local_2c;
    code = code + 1;
  }
  iVar2 = e("Corrupt JPEG");
  return iVar2;
}

Assistant:

static int zbuild_huffman(zhuffman *z, uint8 *sizelist, int num)
{
   int i,k=0;
   int code, next_code[16], sizes[17];

   // DEFLATE spec for generating codes
   memset(sizes, 0, sizeof(sizes));
   memset(z->fast, 255, sizeof(z->fast));
   for (i=0; i < num; ++i)
      ++sizes[sizelist[i]];
   sizes[0] = 0;
   for (i=1; i < 16; ++i)
      assert(sizes[i] <= (1 << i));
   code = 0;
   for (i=1; i < 16; ++i) {
      next_code[i] = code;
      z->firstcode[i] = (uint16) code;
      z->firstsymbol[i] = (uint16) k;
      code = (code + sizes[i]);
      if (sizes[i])
         if (code-1 >= (1 << i)) return e("bad codelengths","Corrupt JPEG");
      z->maxcode[i] = code << (16-i); // preshift for inner loop
      code <<= 1;
      k += sizes[i];
   }
   z->maxcode[16] = 0x10000; // sentinel
   for (i=0; i < num; ++i) {
      int s = sizelist[i];
      if (s) {
         int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
         z->size[c] = (uint8)s;
         z->value[c] = (uint16)i;
         if (s <= ZFAST_BITS) {
            int k = bit_reverse(next_code[s],s);
            while (k < (1 << ZFAST_BITS)) {
               z->fast[k] = (uint16) c;
               k += (1 << s);
            }
         }
         ++next_code[s];
      }
   }
   return 1;
}